

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permute.c
# Opt level: O2

long * permute(long *a,int c,long s)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (a == (long *)0x0) {
    permute::source = permute::source + 1;
  }
  else {
    uVar2 = 0;
    uVar3 = 0;
    permute::set = a;
    if (0 < c) {
      uVar3 = (ulong)(uint)c;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      a[uVar2] = uVar2;
    }
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      dss_random(&permute::source,0,(long)(c + -1),s);
      lVar1 = a[permute::source];
      a[permute::source] = a[uVar2];
      a[uVar2] = lVar1;
      permute::source = 0;
    }
  }
  if (c <= permute::source) {
    permute::source = permute::source - c;
  }
  return permute::set + permute::source;
}

Assistant:

long *
permute(long *a, int c, long s)
	{
    int i;
    static long source;
    static long *set, temp;
    
	if (a != (long *)NULL)
		{
		set = a;
		for (i=0; i < c; i++)
			*(a + i) = i;
		for (i=0; i < c; i++)
			{
			RANDOM(source, 0L, (long)(c - 1), s);
			temp = *(a + source);
			*(a + source) = *(a + i) ;
			*(a + i) = temp;
			source = 0;
			}
		}
	else
		source += 1;
	
	if (source >= c)
		source -= c;
	
	return(set + source);
	}